

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

Track * __thiscall mkvmuxer::Segment::AddTrack(Segment *this,int32_t number)

{
  bool bVar1;
  Track *this_00;
  
  this_00 = (Track *)operator_new(0x78,(nothrow_t *)&std::nothrow);
  if (this_00 != (Track *)0x0) {
    Track::Track(this_00,&this->seed_);
    bVar1 = Tracks::AddTrack(&this->tracks_,this_00,number);
    if (bVar1) {
      return this_00;
    }
    (*this_00->_vptr_Track[1])(this_00);
  }
  return (Track *)0x0;
}

Assistant:

Track* Segment::AddTrack(int32_t number) {
  Track* const track = new (std::nothrow) Track(&seed_);  // NOLINT

  if (!track)
    return NULL;

  if (!tracks_.AddTrack(track, number)) {
    delete track;
    return NULL;
  }

  return track;
}